

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::ScriptContext(ScriptContext *this,ThreadContext *threadContext)

{
  IdleDecommitPageAllocator *pageAllocator;
  bool bVar1;
  Recycler *pRVar2;
  time_t tVar3;
  size_t sizeCat;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  (this->super_ScriptContextBase).pActiveScriptDirect = (IActiveScriptDirect *)0x0;
  (this->super_ScriptContextBase).javascriptLibrary = (JavascriptLibrary *)0x0;
  (this->super_ScriptContextBase).globalObject = (GlobalObject *)0x0;
  (this->super_ScriptContextBase).isClosed = false;
  (this->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)&PTR_GetNullAddr_014db620;
  this->jitFuncRangeCache = (JITPageAddrToFuncRangeCache *)0x0;
  this->next = (ScriptContext *)0x0;
  this->prev = (ScriptContext *)0x0;
  ScriptContextOptimizationOverrideInfo::ScriptContextOptimizationOverrideInfo
            (&this->optimizationOverrides);
  this->CurrentThunk = InterpreterStackFrame::DelayDynamicInterpreterThunk;
  this->CurrentCrossSiteThunk = CrossSite::DefaultThunk;
  this->DeferredParsingThunk = JavascriptFunction::DeferredParsingThunk;
  this->DeferredDeserializationThunk = JavascriptFunction::DeferredDeserializeThunk;
  (this->calleeUtf8SourceInfoList).ptr =
       (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
        *)0x0;
  this->DispatchDefaultInvoke = (JavascriptMethod)0x0;
  this->DispatchProfileInvoke = (JavascriptMethod)0x0;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::ScriptCacheRegistry
            (&this->noSpecialPropertyRegistry,this,&threadContext->noSpecialPropertyRegistry);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::ScriptCacheRegistry
            (&this->onlyWritablePropertyRegistry,this,&threadContext->onlyWritablePropertyRegistry);
  pageAllocator = &threadContext->pageAllocator;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->generalAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,L"SC-General"
             ,&pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->dynamicProfileInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"SC-DynProfileInfo",&pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
  ArenaAllocatorBase(&(this->inlineCacheAllocator).
                      super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                     ,L"SC-InlineCache",&pageAllocator->super_PageAllocator,Throw::OutOfMemory,
                     JsUtil::ExternalApi::RecoverUnusedMemory);
  *(undefined4 *)((long)&(this->inlineCacheAllocator).polyCacheAllocSize + 7) = 0;
  (this->inlineCacheAllocator).polyCacheAllocSize = 0;
  Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->isInstInlineCacheAllocator).
              super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>,
             L"SC-IsInstInlineCache",&pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  (this->isInstInlineCacheAllocator).verifiedAllZeroAndLockedDown = false;
  Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->enumeratorCacheAllocator).
              super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>,
             L"SC-EnumeratorCache",&pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  (this->enumeratorCacheAllocator).verifiedAllZeroAndLockedDown = false;
  this->interpreterArena = (ArenaAllocator *)0x0;
  this->diagnosticArena = (ArenaAllocator *)0x0;
  *(undefined8 *)((long)&this->diagnosticArena + 4) = 0;
  *(undefined8 *)((long)&this->m_remoteScriptContextAddr + 4) = 0;
  this->threadContext = threadContext;
  this->directHostTypeId = TypeIds_GlobalObject;
  this->intConstPropsOnGlobalObject = (PropIdSetForConstProp *)0x0;
  this->intConstPropsOnGlobalUserObject = (PropIdSetForConstProp *)0x0;
  this->firstInterpreterFrameReturnAddress = (void *)0x0;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->sourceCodeAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,L"SC-Code",
             &pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->regexAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,L"SC-Regex",
             &pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->miscAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,L"GC-Misc",
             &pageAllocator->super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  JsUtil::
  BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&(this->bindRef).
                    super_BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ,&this->miscAllocator,0);
  this->stringProfiler = (StringProfiler *)0x0;
  this->bailOutRecordBytes = 0;
  this->bailOutOffsetBytes = 0;
  this->codeSize = 0;
  this->oomExceptionCount = 0;
  this->soExceptionCount = 0;
  this->rejitStatsMap = (RejitStatsMap *)0x0;
  this->bailoutReasonCounts = (BailoutStatsMap *)0x0;
  this->bailoutReasonCountsCap = (BailoutStatsMap *)0x0;
  this->rejitReasonCounts = (uint *)0x0;
  this->rejitReasonCountsCap = (uint *)0x0;
  this->cacheDataMap = (CacheDataMap *)0x0;
  this->fieldAccessStatsByFunctionNumber = (FieldAccessStatsByFunctionNumberMap *)0x0;
  this->regexDebugWriter = (DebugWriter *)0x0;
  this->regexStatsDatabase = (RegexStatsDatabase *)0x0;
  this->trigramAlphabet = (TrigramAlphabet *)0x0;
  this->regexStacks = (RegexStacks *)0x0;
  pRVar2 = ThreadContext::EnsureRecycler(threadContext);
  this->recycler = pRVar2;
  Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
  SmallHeapBlockAllocator(&(this->numberAllocator).allocator);
  (this->numberAllocator).allocator.pfnTrackNativeAllocatedObjectCallBack =
       Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
       TrackNativeAllocatedObject;
  bVar1 = threadContext->isOptimizedForManyInstances;
  (this->config).NoNative = (bool)DAT_015a4e83;
  (this->config).NoDynamicThunks = false;
  (this->config).isOptimizedForManyInstances = bVar1;
  (this->config).threadConfig = &threadContext->configuration;
  this->nativeCodeGen = (NativeCodeGenerator *)0x0;
  this->scriptContextPrivilegeLevel = Low;
  this->interpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  this->backgroundParser = (BackgroundParser *)0x0;
  this->asmJsInterpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  this->asmJsCodeGenerator = (AsmJsCodeGenerator *)0x0;
  this->hostScriptContext = (HostScriptContext *)0x0;
  this->scriptEngineHaltCallback = (HaltCallback *)0x0;
  this->scriptStartEventHandler = (EventHandler)0x0;
  this->scriptEndEventHandler = (EventHandler)0x0;
  this->integerStringMapCacheMissCount = 0;
  this->integerStringMapCacheUseCount = 0;
  this->referencesSharedDynamicSourceContextInfo = false;
  this->isScriptContextActuallyClosed = false;
  this->isFinalized = false;
  this->isEvalRestricted = false;
  this->isInitialized = false;
  this->isCloningGlobal = false;
  this->fastDOMenabled = false;
  this->hasUsedInlineCache = false;
  this->isCloningGlobal = false;
  this->fastDOMenabled = false;
  this->hasUsedInlineCache = false;
  this->hasProtoOrStoreFieldInlineCache = false;
  this->hasIsInstInlineCache = false;
  this->deferredBody = false;
  this->isPerformingNonreentrantWork = false;
  this->isDiagnosticsScriptContext = false;
  this->sourceSize = 0;
  (this->sourceList).ptr =
       (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
        *)0x0;
  this->raiseMessageToDebuggerFunctionType = (RaiseMessageToDebuggerFunctionType)0x0;
  this->transitionToDebugModeIfFirstSourceFn = (TransitionToDebugModeIfFirstSourceFn)0x0;
  this->debugContext = (DebugContext *)0x0;
  (this->debugContextCloseCS).super_CCLock.mutexPtr[0] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[1] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[2] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[3] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[4] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[5] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[6] = '\0';
  (this->debugContextCloseCS).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->debugContextCloseCS).super_CCLock,true);
  (this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->weakReferenceDictionaryList).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->weakReferenceDictionaryList).super_RealCount.count = 0;
  this->isWeakReferenceDictionaryListCleared = false;
  this->isDebugContextInitialized = false;
  this->moduleSrcInfoCount = 0;
  this->url = L"";
  this->webWorkerId = 0;
  (this->TTDHostCallbackFunctor).HostContext = (FinalizableObject *)0x0;
  (this->TTDHostCallbackFunctor).HostRuntime = (void *)0x0;
  (this->TTDHostCallbackFunctor).pfOnScriptLoadCallback = (JsTTDOnScriptLoadCallback)0x0;
  (this->TTDHostCallbackFunctor).pfOnBPRegisterCallback = (JsTTDOnBPRegisterCallback)0x0;
  (this->TTDHostCallbackFunctor).pfOnBPDeleteCallback = (JsTTDOnBPDeleteCallback)0x0;
  (this->TTDHostCallbackFunctor).pfOnBPClearDocumentCallback = (JsTTDOnBPClearDocumentCallback)0x0;
  this->ScriptContextLogTag = 0;
  this->TTDWellKnownInfo = (RuntimeContextInfo *)0x0;
  this->TTDContextInfo = (ScriptContextTTD *)0x0;
  this->TTDSnapshotOrInflateInProgress = false;
  this->TTDRecordOrReplayModeEnabled = false;
  this->TTDRecordModeEnabled = false;
  this->TTDReplayModeEnabled = false;
  this->TTDShouldPerformRecordOrReplayAction = false;
  this->TTDShouldPerformRecordAction = false;
  this->TTDShouldPerformReplayAction = false;
  this->TTDShouldPerformRecordOrReplayDebuggerAction = false;
  this->TTDShouldPerformRecordOrReplayDebuggerAction = false;
  this->TTDShouldPerformRecordDebuggerAction = false;
  this->TTDShouldPerformReplayDebuggerAction = false;
  this->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = false;
  this->emptyStringPropertyId = 0x10;
  this->m_pBuiltinFunctionIdMap = (BuiltinFunctionIdDictionary *)0x0;
  this->builtInLibraryFunctions = (BuiltInLibraryFunctionMap *)0x0;
  this->nextPendingClose = (ScriptContext *)0x0;
  ThreadContext::EnsureDebugManager(threadContext);
  local_38.hasException = true;
  local_38.__exceptionCheck = ExceptionCheck::Save();
  tVar3 = time((time_t *)0x0);
  this->createTime = tVar3;
  memset(&this->convertNullToSimpleCount,0,0x32c);
  memset(&this->objectLiteralInstanceCount,0,0x84c);
  this->interpretedCount = 0;
  this->funcJITCount = 0;
  this->loopJITCount = 0;
  this->bytecodeJITCount = 0;
  this->interpretedCallsHighPri = 0;
  this->maxFuncInterpret = 0;
  this->jitCodeUsed = 0;
  this->funcJitCodeUsed = 0;
  this->speculativeJitCount = 0;
  this->allocId = threadContext->scriptContextCount;
  this->hadProfiled = false;
  this->forinCache = 0;
  this->forinNoCache = 0;
  this->callCount = 0;
  *(undefined4 *)((long)&this->profiler + 7) = 0;
  this->profiler = (ScriptContextProfiler *)0x0;
  this->profileMemoryDump = true;
  pRVar2 = this->recycler;
  (this->numberAllocator).recycler = pRVar2;
  sizeCat = 0x10;
  if (pRVar2->verifyEnabled != false) {
    sizeCat = (ulong)pRVar2->verifyPad + 0x1f & 0xfffffffffffffff0;
  }
  Memory::HeapInfo::
  AddSmallAllocator<Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>>
            (&(pRVar2->autoHeap).defaultHeap,&(this->numberAllocator).allocator,sizeCat);
  this->m_iProfileSession = -1;
  this->urlRecord = (UrlRecord *)0x0;
  this->isRootTrackerScriptContext = false;
  local_38.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_38);
  return;
}

Assistant:

ScriptContext::ScriptContext(ThreadContext* threadContext) :
        ScriptContextBase(),
        prev(nullptr),
        next(nullptr),
        interpreterArena(nullptr),
        moduleSrcInfoCount(0),
        // Regex globals
#if ENABLE_REGEX_CONFIG_OPTIONS
        regexStatsDatabase(0),
        regexDebugWriter(0),
#endif
        trigramAlphabet(nullptr),
        regexStacks(nullptr),
        config(threadContext->GetConfig(), threadContext->IsOptimizedForManyInstances()),
#if ENABLE_BACKGROUND_PARSING
        backgroundParser(nullptr),
#endif
#if ENABLE_NATIVE_CODEGEN
        nativeCodeGen(nullptr),
        m_remoteScriptContextAddr(nullptr),
        jitFuncRangeCache(nullptr),
#endif
        threadContext(threadContext),
        scriptStartEventHandler(nullptr),
        scriptEndEventHandler(nullptr),
#ifdef FAULT_INJECTION
        disposeScriptByFaultInjectionEventHandler(nullptr),
#endif

#ifndef CC_LOW_MEMORY_TARGET
        integerStringMapCacheMissCount(0),
        integerStringMapCacheUseCount(0),
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        diagnosticArena(nullptr),
        raiseMessageToDebuggerFunctionType(nullptr),
        transitionToDebugModeIfFirstSourceFn(nullptr),
        debugContext(nullptr),
        isDebugContextInitialized(false),
        isEnumeratingRecyclerObjects(false),
#endif
        sourceSize(0),
        deferredBody(false),
        isScriptContextActuallyClosed(false),
        isFinalized(false),
        isEvalRestricted(false),
        isInvalidatedForHostObjects(false),
        fastDOMenabled(false),
        directHostTypeId(TypeIds_GlobalObject),
        isPerformingNonreentrantWork(false),
        isDiagnosticsScriptContext(false),
        m_enumerateNonUserFunctionsOnly(false),
        scriptContextPrivilegeLevel(ScriptContextPrivilegeLevel::Low),
        recycler(threadContext->EnsureRecycler()),
        CurrentThunk(DefaultEntryThunk),
        CurrentCrossSiteThunk(CrossSite::DefaultThunk),
        DeferredParsingThunk(DefaultDeferredParsingThunk),
        DeferredDeserializationThunk(DefaultDeferredDeserializeThunk),
        DispatchDefaultInvoke(nullptr),
        DispatchProfileInvoke(nullptr),
        m_pBuiltinFunctionIdMap(nullptr),
        hostScriptContext(nullptr),
        scriptEngineHaltCallback(nullptr),
#if DYNAMIC_INTERPRETER_THUNK
        interpreterThunkEmitter(nullptr),
#endif
#ifdef ASMJS_PLAT
        asmJsInterpreterThunkEmitter(nullptr),
        asmJsCodeGenerator(nullptr),
#endif
        generalAllocator(_u("SC-General"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#ifdef ENABLE_BASIC_TELEMETRY
        telemetryAllocator(_u("SC-Telemetry"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
        dynamicProfileInfoAllocator(_u("SC-DynProfileInfo"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#ifdef SEPARATE_ARENA
        sourceCodeAllocator(_u("SC-Code"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        regexAllocator(_u("SC-Regex"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
#ifdef NEED_MISC_ALLOCATOR
        miscAllocator(_u("GC-Misc"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
        inlineCacheAllocator(_u("SC-InlineCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        isInstInlineCacheAllocator(_u("SC-IsInstInlineCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        enumeratorCacheAllocator(_u("SC-EnumeratorCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        hasUsedInlineCache(false),
        hasProtoOrStoreFieldInlineCache(false),
        hasIsInstInlineCache(false),
        noSpecialPropertyRegistry(this, threadContext->GetNoSpecialPropertyRegistry()),
        onlyWritablePropertyRegistry(this, threadContext->GetOnlyWritablePropertyRegistry()),
        firstInterpreterFrameReturnAddress(nullptr),
        builtInLibraryFunctions(nullptr),
        isWeakReferenceDictionaryListCleared(false)
#if ENABLE_PROFILE_INFO
        , referencesSharedDynamicSourceContextInfo(false)
#endif
#if DBG
        , isInitialized(false)
        , isCloningGlobal(false)
        , bindRef(MiscAllocator())
#endif
#if ENABLE_TTD
        , TTDHostCallbackFunctor()
        , ScriptContextLogTag(TTD_INVALID_LOG_PTR_ID)
        , TTDWellKnownInfo(nullptr)
        , TTDContextInfo(nullptr)
        , TTDSnapshotOrInflateInProgress(false)
        , TTDRecordOrReplayModeEnabled(false)
        , TTDRecordModeEnabled(false)
        , TTDReplayModeEnabled(false)
        , TTDShouldPerformRecordOrReplayAction(false)
        , TTDShouldPerformRecordAction(false)
        , TTDShouldPerformReplayAction(false)
        , TTDShouldPerformRecordOrReplayDebuggerAction(false)
        , TTDShouldPerformRecordDebuggerAction(false)
        , TTDShouldPerformReplayDebuggerAction(false)
        , TTDShouldSuppressGetterInvocationForDebuggerEvaluation(false)
#endif
#ifdef REJIT_STATS
        , rejitStatsMap(nullptr)
        , bailoutReasonCounts(nullptr)
        , bailoutReasonCountsCap(nullptr)
        , rejitReasonCounts(nullptr)
        , rejitReasonCountsCap(nullptr)
#endif
#ifdef ENABLE_BASIC_TELEMETRY
        , telemetry()
#endif
#ifdef INLINE_CACHE_STATS
        , cacheDataMap(nullptr)
#endif
#ifdef FIELD_ACCESS_STATS
        , fieldAccessStatsByFunctionNumber(nullptr)
#endif
        , webWorkerId(Js::Constants::NonWebWorkerContextId)
        , url(_u(""))
        , startupComplete(false)
#ifdef EDIT_AND_CONTINUE
        , activeScriptEditQuery(nullptr)
#endif
#ifdef RECYCLER_PERF_COUNTERS
        , bindReferenceCount(0)
#endif
        , nextPendingClose(nullptr)
#ifdef ENABLE_SCRIPT_PROFILING
        , heapEnum(nullptr)
        , m_fTraceDomCall(FALSE)
#endif
        , intConstPropsOnGlobalObject(nullptr)
        , intConstPropsOnGlobalUserObject(nullptr)
#ifdef PROFILE_STRINGS
        , stringProfiler(nullptr)
#endif
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        , codeSize(0)
        , bailOutRecordBytes(0)
        , bailOutOffsetBytes(0)
#endif
        , emptyStringPropertyId(Js::PropertyIds::_none)
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
       // This may allocate memory and cause exception, but it is ok, as we all we have done so far
       // are field init and those dtor will be called if exception occurs
       threadContext->EnsureDebugManager();
#endif
       // Don't use throwing memory allocation in ctor, as exception in ctor doesn't cause the dtor to be called
       // potentially causing memory leaks
       BEGIN_NO_EXCEPTION;

#ifdef RUNTIME_DATA_COLLECTION
        createTime = time(nullptr);
#endif

#ifdef BGJIT_STATS
        interpretedCount = maxFuncInterpret = funcJITCount = bytecodeJITCount = interpretedCallsHighPri = jitCodeUsed = funcJitCodeUsed = loopJITCount = speculativeJitCount = 0;
#endif

#ifdef PROFILE_TYPES
        convertNullToSimpleCount = 0;
        convertNullToSimpleDictionaryCount = 0;
        convertNullToDictionaryCount = 0;
        convertDeferredToDictionaryCount = 0;
        convertDeferredToSimpleDictionaryCount = 0;
        convertSimpleToDictionaryCount = 0;
        convertSimpleToSimpleDictionaryCount = 0;
        convertPathToDictionaryExceededLengthCount = 0;
        convertPathToDictionaryDeletedCount = 0;
        convertPathToDictionaryAttributesCount = 0;
        convertPathToDictionaryItemAttributesCount = 0;
        convertPathToDictionaryAccessorsCount = 0;
        convertPathToDictionaryItemAccessorsCount = 0;
        convertPathToDictionaryExtensionsCount = 0;
        convertPathToDictionaryProtoCount = 0;
        convertPathToDictionaryNoRootCount = 0;
        convertPathToDictionaryResetCount = 0;
        convertPathToSimpleDictionaryCount = 0;
        convertSimplePathToPathCount = 0;
        convertSimpleDictionaryToDictionaryCount = 0;
        convertSimpleSharedDictionaryToNonSharedCount = 0;
        convertSimpleSharedToNonSharedCount = 0;
        pathTypeHandlerCount = 0;
        promoteCount = 0;
        cacheCount = 0;
        branchCount = 0;
        maxPathLength = 0;
        memset(typeCount, 0, sizeof(typeCount));
        memset(instanceCount, 0, sizeof(instanceCount));
#endif

#ifdef PROFILE_OBJECT_LITERALS
        objectLiteralInstanceCount = 0;
        objectLiteralPathCount = 0;
        memset(objectLiteralCount, 0, sizeof(objectLiteralCount));
        objectLiteralSimpleDictionaryCount = 0;
        objectLiteralMaxLength = 0;
        objectLiteralPromoteCount = 0;
        objectLiteralCacheCount = 0;
        objectLiteralBranchCount = 0;
#endif
#if DBG_DUMP
        byteCodeDataSize = 0;
        byteCodeAuxiliaryDataSize = 0;
        byteCodeAuxiliaryContextDataSize = 0;
        memset(byteCodeHistogram, 0, sizeof(byteCodeHistogram));
#endif

#if DBG || defined(RUNTIME_DATA_COLLECTION)
        this->allocId = threadContext->GetScriptContextCount();
#endif
#if DBG
        this->hadProfiled = false;
#endif
#if DBG_DUMP
        forinCache = 0;
        forinNoCache = 0;
#endif

        callCount = 0;

        threadContext->GetHiResTimer()->Reset();

#ifdef PROFILE_EXEC
        profiler = nullptr;
        isProfilerCreated = false;
        disableProfiler = false;
        ensureParentInfo = false;
#endif

#ifdef PROFILE_MEM
        profileMemoryDump = true;
#endif

#ifdef ENABLE_SCRIPT_PROFILING
        m_pProfileCallback = nullptr;
        m_pProfileCallback2 = nullptr;
        m_inProfileCallback = FALSE;
        CleanupDocumentContext = nullptr;
#endif

        // Do this after all operations that may cause potential exceptions. Note: InitialAllocations may still throw!
        numberAllocator.Initialize(this->GetRecycler());

#if DEBUG
        m_iProfileSession = -1;
#endif
#ifdef LEAK_REPORT
        this->urlRecord = nullptr;
        this->isRootTrackerScriptContext = false;
#endif

        PERF_COUNTER_INC(Basic, ScriptContext);
        PERF_COUNTER_INC(Basic, ScriptContextActive);

        END_NO_EXCEPTION;
    }